

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O3

void req0_send_cb(void *arg)

{
  nni_aio *aio;
  nni_mtx *mtx;
  req0_sock *s;
  nng_err nVar1;
  int iVar2;
  nni_msg *m;
  nni_aio_completions local_28;
  nni_aio_completions sent_list;
  
  s = *(req0_sock **)((long)arg + 8);
  nni_aio_completions_init(&local_28);
  aio = (nni_aio *)((long)arg + 0x40);
  nVar1 = nni_aio_result(aio);
  if (nVar1 == NNG_OK) {
    mtx = &s->mtx;
    nni_mtx_lock(mtx);
    if ((*(char *)((long)arg + 0x38) == '\0') && (s->closed != true)) {
      nni_list_remove(&s->busy_pipes,arg);
      nni_list_append(&s->ready_pipes,arg);
      iVar2 = nni_list_empty(&s->send_queue);
      if (iVar2 != 0) {
        nni_pollable_raise(&s->writable);
      }
      req0_run_send_queue(s,&local_28);
      nni_mtx_unlock(mtx);
      nni_aio_completions_run(&local_28);
    }
    else {
      nni_mtx_unlock(mtx);
    }
  }
  else {
    m = nni_aio_get_msg(aio);
    nni_msg_free(m);
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
req0_send_cb(void *arg)
{
	req0_pipe          *p = arg;
	req0_sock          *s = p->req;
	nni_aio_completions sent_list;

	nni_aio_completions_init(&sent_list);
	if (nni_aio_result(&p->aio_send) != 0) {
		// We failed to send... clean up and deal with it.
		nni_msg_free(nni_aio_get_msg(&p->aio_send));
		nni_aio_set_msg(&p->aio_send, NULL);
		nni_pipe_close(p->pipe);
		return;
	}

	// We completed a cooked send, so we need to reinsert ourselves
	// in the ready list, and re-run the send_queue.

	nni_mtx_lock(&s->mtx);
	if (p->closed || s->closed) {
		// This occurs if the req0_pipe_close has been called.
		// In that case we don't want any more processing.
		nni_mtx_unlock(&s->mtx);
		return;
	}
	nni_list_remove(&s->busy_pipes, p);
	nni_list_append(&s->ready_pipes, p);
	if (nni_list_empty(&s->send_queue)) {
		nni_pollable_raise(&s->writable);
	}
	req0_run_send_queue(s, &sent_list);
	nni_mtx_unlock(&s->mtx);

	nni_aio_completions_run(&sent_list);
}